

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O0

void __thiscall
OpenMPAtomicDefaultMemOrderClause::generateDOT
          (OpenMPAtomicDefaultMemOrderClause *this,ofstream *dot_file,int depth,int index,
          string *parent_node)

{
  OpenMPAtomicDefaultMemOrderClauseKind OVar1;
  char *pcVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  string node_id;
  string parameter_string;
  undefined1 local_1a0 [4];
  OpenMPAtomicDefaultMemOrderClauseKind kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string clause_kind;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string indent;
  string current_line;
  string *parent_node_local;
  int index_local;
  int depth_local;
  ofstream *dot_file_local;
  OpenMPAtomicDefaultMemOrderClause *this_local;
  
  std::__cxx11::string::string((string *)(indent.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,(long)depth,'\t',&local_69);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::to_string(&local_100,depth);
  std::operator+(&local_e0,"atomic_default_mem_order_",&local_100);
  std::operator+(&local_c0,&local_e0,"_");
  std::__cxx11::to_string(&local_120,index);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_c0,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 parent_node);
  std::operator+(&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 "-- ");
  std::operator+(&local_160,&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::operator+(&local_140,&local_160,"\n");
  std::__cxx11::string::operator=((string *)(indent.field_2._M_local_buf + 8),(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)local_1a0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)dot_file,pcVar2);
  std::__cxx11::string::operator+=((string *)local_68,"\t");
  OVar1 = getKind(this);
  std::__cxx11::string::string((string *)(node_id.field_2._M_local_buf + 8));
  if (OVar1 == OMPC_ATOMIC_DEFAULT_MEM_ORDER_seq_cst) {
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"seq_cst");
  }
  else if (OVar1 == OMPC_ATOMIC_DEFAULT_MEM_ORDER_acq_rel) {
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"acq_rel");
  }
  else if (OVar1 == OMPC_ATOMIC_DEFAULT_MEM_ORDER_relaxed) {
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"relaxed");
  }
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "_kind");
    std::operator+(&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::operator+(&local_248,&local_268," -- ");
    std::operator+(&local_228,&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    std::operator+(&local_208,&local_228,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    std::operator+(&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   "\t");
    std::operator+(&local_328,&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    std::operator+(&local_308,&local_328," [label = \"");
    std::operator+(&local_2e8,&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    std::operator+(&local_2c8,&local_2e8,"\\n ");
    std::operator+(&local_2a8,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&node_id.field_2 + 8));
    std::operator+(&local_288,&local_2a8,"\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    std::__cxx11::string::~string((string *)local_1e8);
  }
  std::__cxx11::string::~string((string *)(node_id.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(indent.field_2._M_local_buf + 8));
  return;
}

Assistant:

void OpenMPAtomicDefaultMemOrderClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "atomic_default_mem_order_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPAtomicDefaultMemOrderClauseKind kind = this->getKind();
    std::string parameter_string;
    switch (kind) {
       case OMPC_ATOMIC_DEFAULT_MEM_ORDER_seq_cst:
            parameter_string = "seq_cst";
            break;
        case OMPC_ATOMIC_DEFAULT_MEM_ORDER_acq_rel:
            parameter_string = "acq_rel";
            break;
        case OMPC_ATOMIC_DEFAULT_MEM_ORDER_relaxed:
            parameter_string = "relaxed";
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_kind";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
}